

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::IsRetainedName(string *name)

{
  bool bVar1;
  int iVar2;
  
  if (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsRetainedName(std::__cxx11::string_const&)::
                                 retained_names_abi_cxx11_);
    if (iVar2 != 0) {
      IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[0]._M_dataplus._M_p =
           (pointer)&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[0].
                     field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_,
                 "new","");
      IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[1]._M_dataplus._M_p =
           (pointer)&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[1].
                     field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 1),
                 "alloc","");
      IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[2]._M_dataplus._M_p =
           (pointer)&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[2].
                     field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 2),"copy"
                 ,"");
      IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[3]._M_dataplus._M_p =
           (pointer)&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_[3].
                     field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 3),
                 "mutableCopy","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (name,IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_,4);
  return bVar1;
}

Assistant:

bool IsRetainedName(const string& name) {
  // List of prefixes from
  // http://developer.apple.com/library/mac/#documentation/Cocoa/Conceptual/MemoryMgmt/Articles/mmRules.html
  static const string retained_names[] = {"new", "alloc", "copy",
                                          "mutableCopy"};
  return IsSpecialName(name, retained_names,
                       sizeof(retained_names) / sizeof(retained_names[0]));
}